

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  nghttp2_mem *mem;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *bufs;
  nghttp2_hd_deflater *deflater;
  nghttp2_map_key_type nVar1;
  nghttp2_outbound_item *pnVar2;
  nghttp2_buf_chain *pnVar3;
  uint8_t *puVar4;
  nghttp2_pack_extension_callback p_Var5;
  nghttp2_before_frame_send_callback p_Var6;
  nghttp2_on_frame_not_send_callback p_Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  nghttp2_frame *pnVar12;
  nghttp2_stream *pnVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  void *pvVar17;
  uint8_t uVar18;
  uint uVar19;
  uint32_t uVar20;
  nghttp2_frame *frame;
  ssize_t unaff_RBP;
  ssize_t sVar21;
  int32_t stream_id;
  uint8_t *puVar22;
  char cVar23;
  ulong uVar24;
  bool bVar25;
  
  iVar8 = nghttp2_session_adjust_idle_stream(session);
  if (iVar8 < -900) {
    unaff_RBP = (ssize_t)iVar8;
  }
  else {
    mem = &session->mem;
    aob = &session->aob;
    bufs = &(session->aob).framebufs;
    deflater = &session->hd_deflater;
LAB_00741859:
    do {
code_r0x00741867:
      switch((session->aob).state) {
      case NGHTTP2_OB_POP_ITEM:
        pnVar12 = &nghttp2_session_pop_next_ob_item(session)->frame;
        cVar23 = '\x01';
        if (pnVar12 == (nghttp2_frame *)0x0) {
          sVar21 = 0;
        }
        else {
          uVar18 = (pnVar12->hd).type;
          switch(uVar18) {
          case '\0':
            pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
            if ((pnVar13 == (nghttp2_stream *)0x0) || ((pnVar13->flags & 2) != 0)) {
              pnVar13 = (nghttp2_stream *)0x0;
            }
            else if (pnVar13->state == NGHTTP2_STREAM_IDLE) {
              pnVar13 = (nghttp2_stream *)0x0;
            }
            if ((pnVar13 != (nghttp2_stream *)0x0) && (&pnVar13->item->frame != pnVar12)) {
              __assert_fail("stream->item == item",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                            ,0x91a,
                            "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
            }
            uVar10 = nghttp2_session_predicate_data_send(session,pnVar13);
            if (uVar10 == 0) {
              if (pnVar13 == (nghttp2_stream *)0x0) {
                __assert_fail("stream",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0x930,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              uVar11 = session->remote_window_size;
              uVar10 = (session->remote_settings).max_frame_size;
              uVar19 = pnVar13->remote_window_size;
              if ((int)uVar11 <= pnVar13->remote_window_size) {
                uVar19 = uVar11;
              }
              if ((int)uVar10 <= (int)uVar19) {
                uVar19 = uVar10;
              }
              if ((int)uVar19 < 1) {
                if ((int)uVar11 < 1) {
                  __assert_fail("session->remote_window_size > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0x937,
                                "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                               );
                }
                uVar18 = '\x04';
LAB_0074233b:
                uVar11 = session_defer_stream_item(session,pnVar13,uVar18);
                if (-0x385 < (int)uVar11) {
                  aob->item = (nghttp2_outbound_item *)0x0;
                  active_outbound_item_reset(aob,mem);
                  uVar11 = 0xfffffe04;
                }
              }
              else {
                if (0x3fff < (int)uVar19) {
                  uVar19 = 0x4000;
                }
                uVar11 = nghttp2_session_pack_data
                                   (session,bufs,(ulong)uVar19,pnVar12,
                                    (nghttp2_data_aux_data *)((long)pnVar12 + 0x60),pnVar13);
                if ((int)uVar11 < -0x1fc) {
                  if (uVar11 != 0xfffffdf2) {
                    if (uVar11 == 0xfffffdf7) {
                      uVar11 = session_detach_stream_item(session,pnVar13);
                      if (-0x385 < (int)uVar11) {
                        uVar11 = nghttp2_session_add_rst_stream(session,(pnVar12->hd).stream_id,2);
                        if (-0x385 < (int)uVar11) {
                          uVar11 = 0xfffffdf7;
                        }
                      }
                    }
                    else {
LAB_007427fa:
                      uVar10 = session_detach_stream_item(session,pnVar13);
                      if ((int)uVar10 < -900) {
                        uVar11 = uVar10;
                      }
                    }
                  }
                }
                else if (uVar11 != 0) {
                  if (uVar11 != 0xfffffe04) goto LAB_007427fa;
                  uVar18 = '\b';
                  goto LAB_0074233b;
                }
              }
            }
            else {
              pnVar13 = (nghttp2_stream *)
                        nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
              uVar11 = uVar10;
              if ((pnVar13 != (nghttp2_stream *)0x0) &&
                 (uVar11 = session_detach_stream_item(session,pnVar13), -0x385 < (int)uVar11)) {
                uVar11 = uVar10;
              }
            }
            break;
          case '\x01':
            if ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST) {
              bVar25 = false;
              pnVar13 = nghttp2_session_open_stream
                                  (session,(pnVar12->hd).stream_id,'\0',&(pnVar12->headers).pri_spec
                                   ,NGHTTP2_STREAM_INITIAL,*(void **)((long)pnVar12 + 0x70));
              if (pnVar13 == (nghttp2_stream *)0x0) {
                uVar11 = 0xfffffc7b;
              }
              else {
                uVar11 = 0xfffffe01;
                if ((*(char *)((long)pnVar12 + 0x7c) == '\0') &&
                   (uVar11 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
                  uVar11 = session_is_closing(session);
                  if (uVar11 != 0) {
                    uVar11 = 0xfffffdfc;
                  }
                }
                if (uVar11 == 0) {
                  bVar25 = true;
                  if ((session->opt_flags & 4) == 0) {
                    nghttp2_http_record_request_method(pnVar13,pnVar12);
                  }
                }
                else {
                  bVar25 = false;
                }
              }
              if (bVar25) goto LAB_00742386;
            }
            else {
              pvVar17 = nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
              if ((pvVar17 == (void *)0x0) || ((*(byte *)((long)pvVar17 + 0xd8) & 2) != 0)) {
                pvVar17 = (void *)0x0;
              }
              else if (*(int *)((long)pvVar17 + 0xcc) == 5) {
                pvVar17 = (void *)0x0;
              }
              if (pvVar17 == (void *)0x0) {
                (pnVar12->headers).cat = NGHTTP2_HCAT_HEADERS;
                uVar11 = 0xfffffe02;
LAB_00742267:
                if (uVar11 == 0) {
                  if (pvVar17 == (void *)0x0) {
                    __assert_fail("stream",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                  ,0x7a0,
                                  "int session_predicate_headers_send(nghttp2_session *, nghttp2_stream *)"
                                 );
                  }
                  if (*(int *)((long)pvVar17 + 0xcc) == 2) goto LAB_00742770;
                  if (*(int *)((long)pvVar17 + 0xcc) == 3) {
                    uVar11 = 0xfffffe01;
                  }
                  else if (*(int *)((long)pvVar17 + 0xa8) == 0) {
                    uVar11 = 0xfffffdfe;
                  }
                  else {
                    uVar11 = 0;
                    if (((session->server == '\0' ^ (byte)*(int *)((long)pvVar17 + 0xa8)) & 1) != 0)
                    {
                      uVar11 = 0xfffffdfe;
                    }
                  }
                }
              }
              else {
                iVar8 = *(int *)((long)pvVar17 + 0xcc);
                iVar9 = session_is_closing(session);
                if (iVar8 == 4) {
                  uVar11 = 0xfffffdee;
                  if (iVar9 == 0) {
                    uVar11 = (uint)((*(byte *)((long)pvVar17 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                  }
                  if (((uVar11 == 0) && (uVar11 = 0xfffffe07, session->server != '\0')) &&
                     ((*(int *)((long)pvVar17 + 0xcc) == 4 &&
                      (uVar11 = 0xfffffdfc, (session->goaway_flags & 8) == 0)))) {
                    uVar11 = 0;
                  }
                  if (uVar11 == 0) {
                    (pnVar12->headers).cat = NGHTTP2_HCAT_PUSH_RESPONSE;
                    uVar11 = 0;
                    if (*(long *)((long)pnVar12 + 0x70) != 0) {
                      *(long *)((long)pvVar17 + 0x90) = *(long *)((long)pnVar12 + 0x70);
                    }
                  }
                }
                else {
                  if ((((iVar9 != 0) || ((*(byte *)((long)pvVar17 + 0xd9) & 2) != 0)) ||
                      (session->server == '\0')) ||
                     ((*(uint *)((long)pvVar17 + 0xa8) != 0 &&
                       (*(uint *)((long)pvVar17 + 0xa8) & 1) == 0 ||
                      (*(int *)((long)pvVar17 + 0xcc) != 1)))) {
                    (pnVar12->headers).cat = NGHTTP2_HCAT_HEADERS;
                    iVar8 = session_is_closing(session);
                    uVar11 = 0xfffffdee;
                    if (iVar8 == 0) {
                      uVar11 = (uint)((*(byte *)((long)pvVar17 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                    }
                    goto LAB_00742267;
                  }
                  (pnVar12->headers).cat = NGHTTP2_HCAT_RESPONSE;
LAB_00742770:
                  uVar11 = 0;
                }
              }
              if (uVar11 == 0) {
LAB_00742386:
                sVar15 = nghttp2_hd_deflate_bound
                                   (deflater,(pnVar12->headers).nva,(pnVar12->headers).nvlen);
                uVar11 = 0xfffffdf6;
                if ((((sVar15 + 5 <= session->max_send_header_block_length) &&
                     (uVar11 = nghttp2_frame_pack_headers(bufs,&pnVar12->headers,deflater),
                     uVar11 == 0)) &&
                    (uVar11 = session_headers_add_pad(session,pnVar12), uVar11 == 0)) &&
                   (uVar11 = 0, (pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                  if ((pnVar12->hd).stream_id <= session->last_sent_stream_id) {
                    __assert_fail("session->last_sent_stream_id < frame->hd.stream_id",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                  ,0x9c9,
                                  "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                                 );
                  }
                  session->last_sent_stream_id = (pnVar12->hd).stream_id;
                }
              }
            }
            break;
          case '\x02':
            iVar8 = session_is_closing(session);
            uVar11 = 0xfffffdee;
            if (iVar8 == 0) {
              nghttp2_frame_pack_priority(bufs,&pnVar12->priority);
LAB_00741ca5:
              uVar11 = 0;
            }
            break;
          case '\x03':
            iVar8 = session_is_closing(session);
            uVar11 = 0xfffffdee;
            if (iVar8 == 0) {
              nghttp2_frame_pack_rst_stream(bufs,&pnVar12->rst_stream);
              goto LAB_00741ca5;
            }
            break;
          case '\x04':
            if (((pnVar12->hd).flags & 1) != 0) {
              if (session->obq_flood_counter_ == 0) {
                __assert_fail("session->obq_flood_counter_ > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0x9e5,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
              iVar8 = session_is_closing(session);
              uVar11 = 0xfffffdee;
              if (iVar8 != 0) break;
            }
            uVar11 = nghttp2_frame_pack_settings(bufs,&pnVar12->settings);
            break;
          case '\x05':
            pvVar17 = nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
            if ((pvVar17 == (void *)0x0) || ((*(byte *)((long)pvVar17 + 0xd8) & 2) != 0)) {
              pvVar17 = (void *)0x0;
            }
            else if (*(int *)((long)pvVar17 + 0xcc) == 5) {
              pvVar17 = (void *)0x0;
            }
            if (session->server == '\0') {
              uVar11 = 0xfffffe07;
            }
            else {
              if (pvVar17 == (void *)0x0) {
                uVar11 = 0xfffffe02;
              }
              else {
                iVar8 = session_is_closing(session);
                uVar11 = 0xfffffdee;
                if (iVar8 == 0) {
                  uVar11 = (uint)((*(byte *)((long)pvVar17 + 0xd9) & 2) == 0) * 0x200 - 0x200;
                }
              }
              if (uVar11 == 0) {
                if (pvVar17 == (void *)0x0) {
                  __assert_fail("stream",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0x7d5,
                                "int session_predicate_push_promise_send(nghttp2_session *, nghttp2_stream *)"
                               );
                }
                if ((session->remote_settings).enable_push == 0) {
                  uVar11 = 0xfffffdf0;
                }
                else {
                  uVar11 = 0xfffffe01;
                  if ((*(int *)((long)pvVar17 + 0xcc) != 3) &&
                     (uVar11 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
                    uVar11 = 0;
                  }
                }
              }
            }
            if (uVar11 == 0) {
              if (pvVar17 == (void *)0x0) {
                __assert_fail("stream",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0xa04,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              sVar15 = nghttp2_hd_deflate_bound
                                 (deflater,(pnVar12->push_promise).nva,(pnVar12->push_promise).nvlen
                                 );
              uVar11 = 0xfffffdf6;
              if (((sVar15 <= session->max_send_header_block_length) &&
                  (uVar11 = nghttp2_frame_pack_push_promise(bufs,&pnVar12->push_promise,deflater),
                  uVar11 == 0)) && (uVar11 = session_headers_add_pad(session,pnVar12), uVar11 == 0))
              {
                if ((pnVar12->push_promise).promised_stream_id < session->last_sent_stream_id + 2) {
                  __assert_fail("session->last_sent_stream_id + 2 <= frame->push_promise.promised_stream_id"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0xa18,
                                "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                               );
                }
                session->last_sent_stream_id = (pnVar12->push_promise).promised_stream_id;
                goto LAB_00741ca5;
              }
            }
            break;
          case '\x06':
            if (((pnVar12->hd).flags & 1) != 0) {
              if (session->obq_flood_counter_ == 0) {
                __assert_fail("session->obq_flood_counter_ > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0xa1f,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
            }
            uVar11 = 0xfffffdee;
            if ((session->goaway_flags & 1) == 0) {
              nghttp2_frame_pack_ping(bufs,&pnVar12->ping);
              goto LAB_00741ca5;
            }
            break;
          case '\a':
            uVar11 = nghttp2_frame_pack_goaway(bufs,&pnVar12->goaway);
            if (uVar11 == 0) {
              session->local_last_stream_id = (pnVar12->priority).pri_spec.stream_id;
              goto LAB_00741ca5;
            }
            break;
          case '\b':
            nVar1 = (pnVar12->hd).stream_id;
            iVar8 = session_is_closing(session);
            uVar11 = 0xfffffdee;
            if ((iVar8 == 0) && (uVar11 = 0, nVar1 != 0)) {
              pvVar17 = nghttp2_map_find(&session->streams,nVar1);
              if ((pvVar17 == (void *)0x0) || ((*(byte *)((long)pvVar17 + 0xd8) & 2) != 0)) {
                pvVar17 = (void *)0x0;
              }
              else if (*(int *)((long)pvVar17 + 0xcc) == 5) {
                pvVar17 = (void *)0x0;
              }
              if (pvVar17 == (void *)0x0) {
                uVar11 = 0xfffffe02;
              }
              else if (*(int *)((long)pvVar17 + 0xcc) == 3) {
                uVar11 = 0xfffffe01;
              }
              else if (((*(int *)((long)pvVar17 + 0xcc) == 4) &&
                       (*(int *)((long)pvVar17 + 0xa8) != 0)) &&
                      (uVar11 = 0xfffffdfe,
                      ((session->server == '\0' ^ (byte)*(int *)((long)pvVar17 + 0xa8)) & 1) != 0))
              {
                uVar11 = 0;
              }
            }
            if (uVar11 == 0) {
              nghttp2_frame_pack_window_update(bufs,&pnVar12->window_update);
              goto LAB_00741ca5;
            }
            break;
          case '\t':
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xa3b,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          default:
            if (*(char *)((long)pnVar12 + 0x60) == '\0') {
              iVar8 = session_is_closing(session);
              uVar11 = 0xfffffdee;
              if (iVar8 == 0) {
                p_Var5 = (session->callbacks).pack_extension_callback;
                if (p_Var5 == (nghttp2_pack_extension_callback)0x0) {
                  __assert_fail("session->callbacks.pack_extension_callback",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0x8e7,
                                "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                               );
                }
                pnVar3 = (session->aob).framebufs.head;
                puVar22 = (pnVar3->buf).last;
                uVar24 = (long)(pnVar3->buf).end - (long)puVar22;
                if (0x3fff < uVar24) {
                  uVar24 = 0x4000;
                }
                uVar14 = (*p_Var5)(session,puVar22,uVar24,pnVar12,session->user_data);
                uVar11 = 0xfffffde9;
                if ((uVar14 != 0xfffffffffffffde9) && (uVar11 = 0xfffffc7a, uVar14 <= uVar24)) {
                  (pnVar12->hd).length = uVar14;
                  puVar22 = (pnVar3->buf).pos;
                  puVar4 = (pnVar3->buf).last;
                  if (puVar22 != puVar4) {
                    __assert_fail("buf->pos == buf->last",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                  ,0x8fa,
                                  "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                                 );
                  }
                  (pnVar3->buf).last = puVar4 + uVar14;
                  puVar22 = puVar22 + -9;
                  (pnVar3->buf).pos = puVar22;
                  nghttp2_frame_pack_frame_hd(puVar22,&pnVar12->hd);
                  goto LAB_00741ca5;
                }
              }
            }
            else if (uVar18 == '\x10') {
              nVar1 = *(pnVar12->ext).payload;
              iVar8 = session_is_closing(session);
              uVar11 = 0xfffffdee;
              if (iVar8 == 0) {
                pvVar17 = nghttp2_map_find(&session->streams,nVar1);
                if ((pvVar17 == (void *)0x0) || ((*(byte *)((long)pvVar17 + 0xd8) & 2) != 0)) {
                  pvVar17 = (void *)0x0;
                }
                else if (*(int *)((long)pvVar17 + 0xcc) == 5) {
                  pvVar17 = (void *)0x0;
                }
                if (pvVar17 == (void *)0x0) {
                  uVar11 = 0;
                }
                else {
                  uVar11 = 0xfffffe01;
                  if ((*(int *)((long)pvVar17 + 0xcc) != 3) &&
                     (uVar11 = 0xfffffdfe, (*(byte *)((long)pvVar17 + 0xd9) & 1) == 0)) {
                    uVar11 = 0;
                  }
                }
              }
              if (uVar11 == 0) {
                nghttp2_frame_pack_priority_update(bufs,&pnVar12->ext);
                goto LAB_00741ca5;
              }
            }
            else if (uVar18 == '\f') {
              iVar8 = session_is_closing(session);
              uVar11 = 0xfffffdee;
              if (iVar8 == 0) {
                uVar11 = nghttp2_frame_pack_origin(bufs,&pnVar12->ext);
              }
            }
            else {
              if (uVar18 != '\n') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0xa70,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              nVar1 = (pnVar12->hd).stream_id;
              iVar8 = session_is_closing(session);
              uVar11 = 0xfffffdee;
              if (iVar8 == 0) {
                if (nVar1 == 0) {
                  uVar11 = 0;
                }
                else {
                  pvVar17 = nghttp2_map_find(&session->streams,nVar1);
                  if ((pvVar17 == (void *)0x0) || ((*(byte *)((long)pvVar17 + 0xd8) & 2) != 0)) {
                    pvVar17 = (void *)0x0;
                  }
                  else if (*(int *)((long)pvVar17 + 0xcc) == 5) {
                    pvVar17 = (void *)0x0;
                  }
                  if (pvVar17 == (void *)0x0) {
                    uVar11 = 0xfffffe02;
                  }
                  else {
                    uVar11 = 0;
                    if (*(int *)((long)pvVar17 + 0xcc) == 3) {
                      uVar11 = 0xfffffe01;
                    }
                  }
                }
              }
              if (uVar11 == 0) {
                nghttp2_frame_pack_altsvc(bufs,&pnVar12->ext);
                goto LAB_00741ca5;
              }
            }
          }
          if (uVar11 == 0xfffffdf2) {
            cVar23 = '\x01';
            sVar21 = 0;
          }
          else {
            if (uVar11 != 0xfffffe04) {
              if ((int)uVar11 < 0) {
                if (((pnVar12->hd).type != '\0') &&
                   (p_Var7 = (session->callbacks).on_frame_not_send_callback,
                   0xfffffc7c < uVar11 && p_Var7 != (nghttp2_on_frame_not_send_callback)0x0)) {
                  bVar25 = true;
                  if (((pnVar12->hd).type != '\b') &&
                     (iVar8 = (*p_Var7)(session,pnVar12,uVar11,session->user_data), iVar8 != 0)) {
                    nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar12->hd,mem);
                    nghttp2_mem_free(mem,pnVar12);
                    unaff_RBP = -0x386;
                    bVar25 = false;
                  }
                  cVar23 = '\x01';
                  sVar21 = unaff_RBP;
                  if (!bVar25) goto LAB_00742618;
                }
                cVar23 = '\x01';
                uVar20 = 2;
                if ((pnVar12->hd).type == '\x05') {
                  stream_id = (pnVar12->push_promise).promised_stream_id;
                }
                else {
                  stream_id = 0;
                  if (((pnVar12->hd).type == '\x01') &&
                     ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                    stream_id = (pnVar12->hd).stream_id;
                    if (*(char *)((long)pnVar12 + 0x7c) == '\0') {
                      uVar20 = 7;
                    }
                    else {
                      uVar20 = *(uint32_t *)((long)pnVar12 + 0x78);
                    }
                  }
                }
                if (stream_id != 0) {
                  iVar8 = nghttp2_session_close_stream(session,stream_id,uVar20);
                  sVar21 = (long)iVar8;
                  if (iVar8 < -900) goto LAB_00742618;
                }
                nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar12->hd,mem);
                nghttp2_mem_free(mem,pnVar12);
                active_outbound_item_reset(aob,mem);
                if (uVar11 == 0xfffffdf5) {
                  uVar11 = session_terminate_session
                                     (session,session->last_proc_stream_id,2,(char *)0x0);
                }
                cVar23 = (-0x385 < (int)uVar11) * '\x03' + '\x01';
                sVar21 = unaff_RBP;
                if ((int)uVar11 < -900) {
                  sVar21 = (long)(int)uVar11;
                }
                goto LAB_00742618;
              }
              (session->aob).item = (nghttp2_outbound_item *)pnVar12;
              (session->aob).framebufs.cur = (session->aob).framebufs.head;
              if ((pnVar12->hd).type == '\0') {
                if (*(char *)((long)pnVar12 + 0x72) != '\0') {
                  (session->aob).state = NGHTTP2_OB_SEND_NO_COPY;
                  goto LAB_00742612;
                }
              }
              else {
                p_Var6 = (session->callbacks).before_frame_send_callback;
                if (p_Var6 == (nghttp2_before_frame_send_callback)0x0) {
                  iVar8 = 0;
                }
                else {
                  iVar9 = (*p_Var6)(session,pnVar12,session->user_data);
                  iVar8 = -0x386;
                  if (iVar9 == 0) {
                    iVar8 = iVar9;
                  }
                  if (iVar9 == -0x217) {
                    iVar8 = iVar9;
                  }
                }
                if (iVar8 < -900) {
                  unaff_RBP = (ssize_t)iVar8;
LAB_00742570:
                  cVar23 = '\x01';
LAB_00742576:
                  bVar25 = false;
                }
                else {
                  if (iVar8 == -0x217) {
                    p_Var7 = (session->callbacks).on_frame_not_send_callback;
                    if ((p_Var7 != (nghttp2_on_frame_not_send_callback)0x0) &&
                       (iVar8 = (*p_Var7)(session,pnVar12,-0x217,session->user_data), iVar8 != 0)) {
                      unaff_RBP = -0x386;
                      goto LAB_00742570;
                    }
                    uVar20 = 2;
                    if ((pnVar12->hd).type == '\x05') {
                      lVar16 = 0x28;
                      uVar20 = 2;
LAB_0074272c:
                      iVar8 = *(int *)((long)pnVar12 + lVar16);
                    }
                    else {
                      iVar8 = 0;
                      if (((pnVar12->hd).type == '\x01') &&
                         ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                        lVar16 = 8;
                        uVar20 = 7;
                        goto LAB_0074272c;
                      }
                    }
                    if (iVar8 != 0) {
                      iVar8 = nghttp2_session_close_stream(session,iVar8,uVar20);
                      if (iVar8 < -900) {
                        bVar25 = false;
                        cVar23 = '\x01';
                        unaff_RBP = (long)iVar8;
                        goto LAB_00742603;
                      }
                    }
                    active_outbound_item_reset(aob,mem);
                    cVar23 = '\x04';
                    goto LAB_00742576;
                  }
                  cVar23 = '\0';
                  bVar25 = true;
                }
LAB_00742603:
                sVar21 = unaff_RBP;
                if (!bVar25) goto LAB_00742618;
              }
              (session->aob).state = NGHTTP2_OB_SEND_DATA;
            }
LAB_00742612:
            cVar23 = '\x04';
            sVar21 = unaff_RBP;
          }
        }
LAB_00742618:
        unaff_RBP = sVar21;
        if (cVar23 != '\x04') {
          return sVar21;
        }
        goto LAB_00741859;
      case NGHTTP2_OB_SEND_DATA:
        pnVar3 = (session->aob).framebufs.cur;
        puVar22 = (pnVar3->buf).pos;
        if (puVar22 == (pnVar3->buf).last) {
          if ((fast_cb == 0) && (iVar8 = session_after_frame_sent1(session), iVar8 < 0)) {
            if (-0x385 < iVar8) {
              __assert_fail("nghttp2_is_fatal(rv)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                            ,0xd8a,
                            "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                           );
            }
          }
          else {
            iVar8 = session_after_frame_sent2(session);
            bVar25 = true;
            if (-1 < iVar8) break;
            if (-0x385 < iVar8) {
              __assert_fail("nghttp2_is_fatal(rv)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                            ,0xd91,
                            "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                           );
            }
          }
          unaff_RBP = (ssize_t)iVar8;
        }
        else {
          *data_ptr = puVar22;
          puVar22 = (pnVar3->buf).last;
          unaff_RBP = (long)puVar22 - (long)(pnVar3->buf).pos;
          (pnVar3->buf).pos = puVar22;
        }
        bVar25 = false;
        break;
      case NGHTTP2_OB_SEND_NO_COPY:
        pnVar2 = (session->aob).item;
        pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar2->frame).hd.stream_id)
        ;
        if ((pnVar13 == (nghttp2_stream *)0x0) || ((pnVar13->flags & 2) != 0)) {
          pnVar13 = (nghttp2_stream *)0x0;
        }
        else if (pnVar13->state == NGHTTP2_STREAM_IDLE) {
          pnVar13 = (nghttp2_stream *)0x0;
        }
        if (pnVar13 == (nghttp2_stream *)0x0) {
LAB_00741a39:
          active_outbound_item_reset(aob,mem);
          bVar25 = true;
        }
        else {
          pnVar12 = &((session->aob).item)->frame;
          iVar8 = (*(session->callbacks).send_data_callback)
                            (session,pnVar12,(((session->aob).framebufs.cur)->buf).pos,
                             (pnVar12->hd).length - (pnVar12->data).padlen,
                             (nghttp2_data_source *)((long)pnVar12 + 0x60),session->user_data);
          if (((0x16 < iVar8 + 0x20eU) || ((0x400021U >> (iVar8 + 0x20eU & 0x1f) & 1) == 0)) &&
             (iVar8 != 0)) {
            iVar8 = -0x386;
          }
          iVar9 = iVar8;
          if (-0x385 < iVar8) {
            if (iVar8 == -0x1f8) {
              bVar25 = false;
              unaff_RBP = 0;
              break;
            }
            if (iVar8 == -0x209) {
              iVar9 = session_detach_stream_item(session,pnVar13);
              if ((-0x385 < iVar9) &&
                 (iVar9 = nghttp2_session_add_rst_stream(session,(pnVar2->frame).hd.stream_id,2),
                 -0x385 < iVar9)) goto LAB_00741a39;
            }
            else {
              bVar25 = iVar8 != -0x20e;
              iVar9 = session_after_frame_sent1(session);
              if (iVar9 < 0) {
                if (-0x385 < iVar9) {
                  __assert_fail("nghttp2_is_fatal(rv)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0xdd2,
                                "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                               );
                }
              }
              else {
                iVar9 = session_after_frame_sent2(session);
                if (-1 < iVar9) {
                  if (iVar8 == -0x20e) {
                    unaff_RBP = 0;
                  }
                  break;
                }
                if (-0x385 < iVar9) {
                  __assert_fail("nghttp2_is_fatal(rv)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                ,0xdd7,
                                "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                               );
                }
              }
            }
          }
          unaff_RBP = (ssize_t)iVar9;
          bVar25 = false;
        }
        break;
      case NGHTTP2_OB_SEND_CLIENT_MAGIC:
        pnVar3 = (session->aob).framebufs.cur;
        puVar22 = (pnVar3->buf).pos;
        if (puVar22 != (pnVar3->buf).last) {
          *data_ptr = puVar22;
          puVar22 = (pnVar3->buf).last;
          puVar4 = (pnVar3->buf).pos;
          (pnVar3->buf).pos = puVar22;
          return (long)puVar22 - (long)puVar4;
        }
        active_outbound_item_reset(aob,mem);
        goto LAB_00741859;
      default:
        goto code_r0x00741867;
      }
    } while (bVar25);
  }
  return unaff_RBP;
}

Assistant:

static ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                 const uint8_t **data_ptr,
                                                 int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {

            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          int rv2;
          rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                             error_code);

          if (nghttp2_is_fatal(rv2)) {
            return rv2;
          }
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminiate
             connection. */
          rv = nghttp2_session_terminate_session(session,
                                                 NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                    session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%zd\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          rv = session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          rv = session_after_frame_sent2(session);
        }
        if (rv < 0) {
          /* FATAL */
          assert(nghttp2_is_fatal(rv));
          return rv;
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        rv = session_detach_stream_item(session, stream);

        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      rv = session_after_frame_sent2(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    }
  }
}